

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O1

int __thiscall libchars::terminal_driver::initialize__(terminal_driver *this,int fd_in,int fd_out)

{
  int iVar1;
  debug *pdVar2;
  size_t __n;
  double __x;
  double __x_00;
  undefined1 local_6c [8];
  termios new_termios;
  size_t x;
  size_t y;
  
  pdVar2 = debug::initialize(0);
  debug::log(pdVar2,__x);
  this->fd_r = fd_in;
  this->fd_w = fd_out;
  if (-1 < (fd_out | fd_in)) {
    iVar1 = isatty(fd_in);
    this->is_tty = iVar1 != 0;
    if (iVar1 != 0) {
      ttyname(this->fd_r);
    }
    pdVar2 = debug::initialize(0);
    debug::log(pdVar2,__x_00);
    tcgetattr(this->fd_r,(termios *)this);
    tcgetattr(this->fd_r,(termios *)local_6c);
    local_6c._0_4_ = 0;
    local_6c._4_4_ = 5;
    new_termios.c_oflag = 0;
    new_termios.c_lflag._2_2_ = 0x100;
    tcsetattr(this->fd_r,1,(termios *)local_6c);
    if (this->is_tty == true) {
      __n = 2000;
      iVar1 = cursor_position(this,(size_t *)&new_termios.c_ispeed,&x,2000);
      this->control_enabled = -1 < iVar1;
      if (-1 >= iVar1) {
        write(this,0x115d01,(void *)0x2,__n);
      }
      get_terminal_width_and_height(this);
    }
  }
  return 0;
}

Assistant:

int terminal_driver::initialize__(int fd_in, int fd_out)
    {
        LC_LOG_DEBUG("START:%d,%d",fd_in,fd_out);
        fd_r = fd_in;
        fd_w = fd_out;

        if (fd_r >= 0 && fd_w >= 0) {
            // read terminal settings
            is_tty = isatty(fd_r);
            const char *term_tty_name = is_tty ? ttyname(fd_r) : "-";
            LC_LOG_DEBUG("INIT:%s",term_tty_name);

            (void)tcgetattr(fd_r, &original_termios);

            // put terminal in raw mode
            struct termios new_termios;
            (void)tcgetattr(fd_r, &new_termios);
            new_termios.c_iflag = 0;
            new_termios.c_oflag = OPOST | ONLCR;
            new_termios.c_lflag = 0;
            new_termios.c_cc[VMIN] = 1;
            new_termios.c_cc[VTIME] = 0;
            (void)tcsetattr(fd_r, TCSADRAIN, &new_termios);

            if (is_tty) {
                // auto-disable control sequences if cursor position reply not seen before timeout
                size_t x,y;
                control_enabled = (cursor_position(x,y,LC_CONTROL_CHECK_TIMEOUT_ms) >= 0);
                if (!control_enabled) 
                    newline();
                get_terminal_width_and_height(); 
            }
        }
        return 0;
    }